

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

AssertionResult * __thiscall Catch::AssertionResult::getMessage_abi_cxx11_(AssertionResult *this)

{
  long in_RSI;
  AssertionResult *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x90));
  return this;
}

Assistant:

std::string AssertionResult::getMessage() const {
		return m_resultData.message;
	}